

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<int>::growAppend(QCommonArrayOps<int> *this,int *b,int *e)

{
  long n;
  int *piVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_48;
  int *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 2;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (int *)0x0;
    piVar1 = (this->super_Type).super_QArrayDataPointer<int>.ptr;
    if ((b < piVar1) || (piVar1 + (this->super_Type).super_QArrayDataPointer<int>.size <= b)) {
      QArrayDataPointer<int>::detachAndGrow
                ((QArrayDataPointer<int> *)this,GrowsAtEnd,n,(int **)0x0,
                 (QArrayDataPointer<int> *)0x0);
      piVar1 = b;
    }
    else {
      QArrayDataPointer<int>::detachAndGrow
                ((QArrayDataPointer<int> *)this,GrowsAtEnd,n,&local_28,&local_48);
      piVar1 = local_28;
    }
    QPodArrayOps<int>::copyAppend
              (&this->super_Type,piVar1,(int *)(((long)e - (long)b) + (long)piVar1));
    QArrayDataPointer<int>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }